

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedShaderImpl::CreateShaderGL
          (SerializedShaderImpl *this,IReferenceCounters *pRefCounters,ShaderCreateInfo *ShaderCI,
          RENDER_DEVICE_TYPE DeviceType,IDataBlob **ppCompilerOutput)

{
  SerializationDeviceImpl *pSVar1;
  SerializationDeviceImpl *pSVar2;
  IThreadPool *pIVar3;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var4;
  pointer pAVar5;
  _Head_base<0UL,_Diligent::AsyncInitializer_*,_false> __p;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> this_00;
  IMemoryAllocator *RawAllocator;
  IReferenceCounters *pRefCounters_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  undefined4 in_register_0000000c;
  char (*Args_1) [26];
  SerializedShaderImpl *pSVar6;
  string msg;
  string local_80;
  pointer local_60;
  unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_> *local_58
  ;
  SerializedShaderImpl *local_50;
  RefCntAutoPtr<TaskImpl> local_48;
  ShaderCreateInfoWrapper *local_40;
  _Head_base<0UL,_Diligent::AsyncInitializer_*,_false> local_38;
  
  Args_1 = (char (*) [26])CONCAT44(in_register_0000000c,DeviceType);
  if ((ppCompilerOutput != (IDataBlob **)0x0) && (*ppCompilerOutput != (IDataBlob *)0x0)) {
    ppCompilerOutput = (IDataBlob **)0x0;
  }
  pSVar1 = this->m_pDevice;
  if ((this->m_Shaders)._M_elems[0]._M_t.
      super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl
      != (CompiledShader *)0x0) {
    FormatString<char[57]>
              (&local_80,(char (*) [57])"Shader has already been initialized for this device type");
    Args_1 = (char (*) [26])0x6f;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"CreateShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  this_00._M_head_impl = (CompiledShader *)operator_new(0x120);
  pSVar2 = this->m_pDevice;
  (this_00._M_head_impl)->_vptr_CompiledShader = (_func_int **)&PTR__CompiledShaderGL_00afe548;
  this_00._M_head_impl[1] = (CompiledShader)pSVar2;
  local_50 = this;
  RawAllocator = GetRawAllocator();
  local_40 = (ShaderCreateInfoWrapper *)(this_00._M_head_impl + 2);
  ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(local_40,ShaderCI,RawAllocator);
  ((CreateInfo *)(this_00._M_head_impl + 0x18))->DeviceInfo =
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_DeviceInfo;
  this_00._M_head_impl[0x19] =
       (CompiledShader)
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_AdapterInfo;
  this_00._M_head_impl[0x1a] = (CompiledShader)ppCompilerOutput;
  *(RENDER_DEVICE_TYPE *)(this_00._M_head_impl + 0x1b) = DeviceType;
  local_58 = (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
              *)(this_00._M_head_impl + 0x1c);
  (((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_> *)
   (this_00._M_head_impl + 0x1c))->_M_t).
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i =
       SHADER_STATUS_UNINITIALIZED;
  (((String *)(this_00._M_head_impl + 0x1e))->_M_dataplus)._M_p =
       (pointer)(this_00._M_head_impl + 0x20);
  this_00._M_head_impl[0x1f] = (_func_int **)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(this_00._M_head_impl + 0x20))->_M_local_buf[0] = '\0';
  ((RefCntAutoPtr<Diligent::IShader> *)(this_00._M_head_impl + 0x22))->m_pObject = (IShader *)0x0;
  *(bool *)(this_00._M_head_impl + 0x23) = false;
  pIVar3 = (pSVar2->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
           m_pShaderCompilationThreadPool.m_pObject;
  LOCK();
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i = SHADER_STATUS_COMPILING
  ;
  UNLOCK();
  if ((pIVar3 == (IThreadPool *)0x0) ||
     ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == SHADER_COMPILE_FLAG_NONE)) {
    anon_unknown_1::CompiledShaderGL::InitializeSource((CompiledShaderGL *)this_00._M_head_impl);
    pSVar6 = local_50;
    anon_unknown_1::CompiledShaderGL::CreateGLShader((CompiledShaderGL *)this_00._M_head_impl);
  }
  else {
    local_60 = (pointer)operator_new(0x18);
    pRefCounters_00 = (IReferenceCounters *)operator_new(0x30);
    pRefCounters_00->_vptr_IReferenceCounters = (_func_int **)&PTR_AddStrongRef_00afcfc0;
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 0;
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[4]._vptr_IReferenceCounters = (_func_int **)0x0;
    *(undefined1 *)&pRefCounters_00[5]._vptr_IReferenceCounters = 0;
    this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)malloc(0x28);
    RefCountedObject<Diligent::IAsyncTask>::RefCountedObject<>
              ((RefCountedObject<Diligent::IAsyncTask> *)this_01,pRefCounters_00);
    pSVar6 = local_50;
    this_01[1]._M_local_buf[0] = '\0';
    *(undefined8 *)((long)this_01 + 0x14) = 0x100000000;
    this_01->_M_allocated_capacity = (size_type)&PTR_QueryInterface_00afe5a8;
    (((RefCountedObject<Diligent::IAsyncTask> *)(this_01->_M_local_buf + 0x20))->super_IAsyncTask).
    super_IObject._vptr_IObject = (_func_int **)this_00._M_head_impl;
    if (*(int *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) != 0) {
      FormatString<char[33]>(&local_80,(char (*) [33])"Object has already been attached");
      Args_1 = (char (*) [26])0x10d;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"Attach",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x10d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)&PTR_DestroyObject_00afe648;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)this_01;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    LOCK();
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 1;
    UNLOCK();
    local_48.m_pObject = (TaskImpl *)this_01;
    if (*(RefCountersImpl **)((long)this_01 + 8) == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_80,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",Args_1);
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef(*(RefCountersImpl **)((long)this_01 + 8));
    (*(pIVar3->super_IObject)._vptr_IObject[4])(pIVar3,this_01,0,0);
    local_48.m_pObject = (TaskImpl *)0x0;
    local_80._M_dataplus._M_p = (pointer)this_01;
    RefCntAutoPtr<TaskImpl>::~RefCntAutoPtr(&local_48);
    pAVar5 = local_60;
    (local_60->m_Status)._M_i = ASYNC_TASK_STATUS_NOT_STARTED;
    (local_60->m_TaskLock).m_IsLocked._M_base._M_i = false;
    RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
              (&local_60->m_wpTask,(RefCntAutoPtr<Diligent::IAsyncTask> *)&local_80);
    local_38._M_head_impl = pAVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_80._M_dataplus._M_p + 0x10))();
      local_80._M_dataplus._M_p = (pointer)0x0;
    }
    __p._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (AsyncInitializer *)0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)local_58,__p._M_head_impl);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_38);
  }
  _Var4._M_head_impl =
       (pSVar6->m_Shaders)._M_elems[0]._M_t.
       super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       ._M_t.
       super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl;
  (pSVar6->m_Shaders)._M_elems[0]._M_t.
  super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var4._M_head_impl != (CompiledShader *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_CompiledShader[1])();
  }
  return;
}

Assistant:

void SerializedShaderImpl::CreateShaderGL(IReferenceCounters*     pRefCounters,
                                          const ShaderCreateInfo& ShaderCI,
                                          RENDER_DEVICE_TYPE      DeviceType,
                                          IDataBlob**             ppCompilerOutput) noexcept(false)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        m_pDevice->GetDeviceInfo(),
        m_pDevice->GetAdapterInfo(),
        // Do not overwrite compiler output from other APIs.
        // TODO: collect all outputs.
        ppCompilerOutput == nullptr || *ppCompilerOutput == nullptr ? ppCompilerOutput : nullptr,
    };

    CreateShader<CompiledShaderGL>(DeviceType::OpenGL, pRefCounters, ShaderCI, GLShaderCI, m_pDevice, DeviceType);
}